

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_DigestInit(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism)

{
  CK_MECHANISM_TYPE CVar1;
  int iVar2;
  Session *this_00;
  CryptoFactory *pCVar3;
  HashAlgorithm *inDigestOp;
  Type inHashAlgo;
  CK_RV CVar4;
  undefined4 extraout_var;
  
  CVar4 = 400;
  if (this->isInitialised == true) {
    if (pMechanism == (CK_MECHANISM_PTR)0x0) {
      CVar4 = 7;
    }
    else {
      this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
      if (this_00 == (Session *)0x0) {
        CVar4 = 0xb3;
      }
      else {
        iVar2 = Session::getOpType(this_00);
        CVar4 = 0x90;
        if (iVar2 == 0) {
          CVar1 = pMechanism->mechanism;
          CVar4 = 0x70;
          if ((long)CVar1 < 0x255) {
            if (CVar1 == 0x210) {
              inHashAlgo = MD5;
            }
            else if (CVar1 == 0x220) {
              inHashAlgo = SHA1;
            }
            else {
              if (CVar1 != 0x250) {
                return 0x70;
              }
              inHashAlgo = SHA256;
            }
          }
          else if (CVar1 == 0x255) {
            inHashAlgo = SHA224;
          }
          else if (CVar1 == 0x260) {
            inHashAlgo = SHA384;
          }
          else {
            if (CVar1 != 0x270) {
              return 0x70;
            }
            inHashAlgo = SHA512;
          }
          pCVar3 = CryptoFactory::i();
          iVar2 = (*pCVar3->_vptr_CryptoFactory[4])(pCVar3,(ulong)inHashAlgo);
          inDigestOp = (HashAlgorithm *)CONCAT44(extraout_var,iVar2);
          if (inDigestOp != (HashAlgorithm *)0x0) {
            iVar2 = (*inDigestOp->_vptr_HashAlgorithm[2])(inDigestOp);
            if ((char)iVar2 == '\0') {
              pCVar3 = CryptoFactory::i();
              (*pCVar3->_vptr_CryptoFactory[5])(pCVar3,inDigestOp);
              CVar4 = 5;
            }
            else {
              Session::setOpType(this_00,4);
              Session::setDigestOp(this_00,inDigestOp);
              Session::setHashAlgo(this_00,inHashAlgo);
              CVar4 = 0;
            }
          }
        }
      }
    }
  }
  return CVar4;
}

Assistant:

CK_RV SoftHSM::C_DigestInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the mechanism
	HashAlgo::Type algo = HashAlgo::Unknown;
	switch(pMechanism->mechanism) {
#ifndef WITH_FIPS
		case CKM_MD5:
			algo = HashAlgo::MD5;
			break;
#endif
		case CKM_SHA_1:
			algo = HashAlgo::SHA1;
			break;
		case CKM_SHA224:
			algo = HashAlgo::SHA224;
			break;
		case CKM_SHA256:
			algo = HashAlgo::SHA256;
			break;
		case CKM_SHA384:
			algo = HashAlgo::SHA384;
			break;
		case CKM_SHA512:
			algo = HashAlgo::SHA512;
			break;
#ifdef WITH_GOST
		case CKM_GOSTR3411:
			algo = HashAlgo::GOST;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}
	HashAlgorithm* hash = CryptoFactory::i()->getHashAlgorithm(algo);
	if (hash == NULL) return CKR_MECHANISM_INVALID;

	// Initialize hashing
	if (hash->hashInit() == false)
	{
		CryptoFactory::i()->recycleHashAlgorithm(hash);
		return CKR_GENERAL_ERROR;
	}

	session->setOpType(SESSION_OP_DIGEST);
	session->setDigestOp(hash);
	session->setHashAlgo(algo);

	return CKR_OK;
}